

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFExpression::Operation::extract
          (Operation *this,DataExtractor Data,uint16_t Version,uint8_t AddressSize,uint64_t Offset)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint64_t uVar7;
  long lVar8;
  undefined1 uVar9;
  uint8_t uVar10;
  Encoding EVar11;
  uint64_t local_38;
  uint64_t Offset_local;
  
  local_38 = Offset;
  bVar2 = DataExtractor::getU8(&Data,&local_38,(Error *)0x0);
  this->Opcode = bVar2;
  if ((getOpDesc(unsigned_int)::Descriptions == '\0') &&
     (iVar6 = __cxa_guard_acquire(&getOpDesc(unsigned_int)::Descriptions), iVar6 != 0)) {
    getOpDesc(unsigned_int)::Descriptions = 0;
    DAT_01176c78 = 0;
    _DAT_01176c80 = 0;
    std::
    vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
    ::resize((vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
              *)&getOpDesc(unsigned_int)::Descriptions,0xff);
    lVar8 = getOpDesc(unsigned_int)::Descriptions;
    *(undefined2 *)(getOpDesc(unsigned_int)::Descriptions + 9) = 0x502;
    *(undefined1 *)(lVar8 + 0xb) = 0xff;
    *(undefined2 *)(lVar8 + 0x12) = 0xff02;
    *(undefined1 *)(lVar8 + 0x14) = 0xff;
    *(undefined8 *)(lVar8 + 0x18) = 0x102ff8002ff0002;
    *(undefined8 *)(lVar8 + 0x20) = 0x2ff0202ff8102ff;
    *(undefined8 *)(lVar8 + 0x28) = 0xff8302ff0302ff82;
    *(undefined8 *)(lVar8 + 0x30) = 0xff02ff8402ff0402;
    *(undefined8 *)(lVar8 + 0x38) = 0x2ffff02ffff02ff;
    *(undefined8 *)(lVar8 + 0x40) = 0xffff02ffff02ff00;
    *(undefined8 *)(lVar8 + 0x48) = 0xff02ffff02ffff02;
    *(undefined8 *)(lVar8 + 0x50) = 0x2ffff02ffff02ff;
    *(undefined8 *)(lVar8 + 0x58) = 0xffff02ffff02ffff;
    *(undefined8 *)(lVar8 + 0x60) = 0xff02ffff02ffff02;
    *(undefined8 *)(lVar8 + 0x68) = 0x2ffff02ff0402ff;
    *(undefined8 *)(lVar8 + 0x70) = 0xffff02ffff02ffff;
    lVar8 = getOpDesc(unsigned_int)::Descriptions;
    *(undefined8 *)(getOpDesc(unsigned_int)::Descriptions + 0x78) = 0xff02ffff02ff8102;
    *(undefined8 *)(lVar8 + 0x80) = 0x2ffff02ffff02ff;
    *(undefined8 *)(lVar8 + 0x88) = 0xff8102ffff02ffff;
    for (lVar8 = 0; lVar1 = getOpDesc(unsigned_int)::Descriptions, lVar8 != 0x60; lVar8 = lVar8 + 3)
    {
      *(undefined2 *)(getOpDesc(unsigned_int)::Descriptions + 0x90 + lVar8) = 0xff02;
      *(undefined1 *)(lVar1 + 0x92 + lVar8) = 0xff;
    }
    for (lVar8 = 0; lVar1 = getOpDesc(unsigned_int)::Descriptions, lVar8 != 0x60; lVar8 = lVar8 + 3)
    {
      *(undefined2 *)(getOpDesc(unsigned_int)::Descriptions + 0xf0 + lVar8) = 0xff02;
      *(undefined1 *)(lVar1 + 0xf2 + lVar8) = 0xff;
    }
    for (lVar8 = 0; lVar1 = getOpDesc(unsigned_int)::Descriptions, lVar8 != 0x60; lVar8 = lVar8 + 3)
    {
      *(undefined2 *)(getOpDesc(unsigned_int)::Descriptions + 0x150 + lVar8) = 0x8402;
      *(undefined1 *)(lVar1 + 0x152 + lVar8) = 0xff;
    }
    *(undefined8 *)(getOpDesc(unsigned_int)::Descriptions + 0x1b0) = 0x402ff8402ff0402;
    *(undefined8 *)(lVar1 + 0x1b8) = 0x2ff0002ff040284;
    *(undefined8 *)(lVar1 + 0x1c0) = 0xffff03ffff02ff00;
    *(undefined8 *)(lVar1 + 0x1c8) = 0x603ff0203ff0103;
    *(undefined4 *)(lVar1 + 0x1d0) = 0xffff03ff;
    *(undefined4 *)(lVar1 + 0x1d4) = 0x3ffff03;
    *(undefined4 *)(lVar1 + 0x1d8) = 0x4030404;
    *(undefined4 *)(lVar1 + 0x1dc) = 0xffff0307;
    *(undefined2 *)(lVar1 + 0x2c7) = 0x404;
    *(undefined1 *)(lVar1 + 0x2c9) = 0x84;
    *(undefined2 *)(lVar1 + 0x2a0) = 0xff03;
    *(undefined1 *)(lVar1 + 0x2a2) = 0xff;
    *(undefined2 *)(lVar1 + 0x1e3) = 0x404;
    *(undefined1 *)(lVar1 + 0x1e5) = 0xff;
    *(undefined4 *)(lVar1 + 0x2f1) = 0x4ff0404;
    *(undefined2 *)(lVar1 + 0x2f5) = 0xff04;
    *(undefined2 *)(lVar1 + 0x2d9) = 0x404;
    *(undefined1 *)(lVar1 + 0x2db) = 0xff;
    *(undefined2 *)(lVar1 + 0x1f8) = 0x805;
    *(undefined1 *)(lVar1 + 0x1fa) = 0xff;
    *(undefined2 *)(lVar1 + 0x1e9) = 0x405;
    *(undefined1 *)(lVar1 + 0x1eb) = 0xff;
    __cxa_atexit(std::
                 vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
                 ::~vector,&getOpDesc(unsigned_int)::Descriptions,&__dso_handle);
    __cxa_guard_release(&getOpDesc(unsigned_int)::Descriptions);
  }
  if ((ulong)bVar2 < (ulong)((DAT_01176c78 - getOpDesc(unsigned_int)::Descriptions) / 3)) {
    lVar8 = (ulong)bVar2 * 3;
    cVar3 = *(char *)(getOpDesc(unsigned_int)::Descriptions + lVar8);
    uVar9 = *(undefined1 *)(getOpDesc(unsigned_int)::Descriptions + 1 + lVar8);
    EVar11 = *(Encoding *)(getOpDesc(unsigned_int)::Descriptions + 2 + lVar8);
  }
  else {
    EVar11 = SizeNA;
    cVar3 = '\0';
    uVar9 = 0xff;
  }
  (this->Desc).Op[1] = EVar11;
  (this->Desc).Version = cVar3;
  (this->Desc).Op[0] = uVar9;
  if (cVar3 != '\0') {
    uVar10 = '\x04';
    if (Version == 2) {
      uVar10 = AddressSize;
    }
    for (lVar8 = 0; (lVar8 != 2 && (EVar11 = (this->Desc).Op[lVar8], EVar11 != SizeNA));
        lVar8 = lVar8 + 1) {
      switch(EVar11 & ~SignBit) {
      case Size1:
        bVar2 = DataExtractor::getU8(&Data,&local_38,(Error *)0x0);
        this->Operands[lVar8] = (ulong)bVar2;
        if (-1 < (char)EVar11) break;
        uVar7 = (uint64_t)(char)bVar2;
        goto LAB_00d9a25c;
      case Size2:
        uVar4 = DataExtractor::getU16(&Data,&local_38,(Error *)0x0);
        this->Operands[lVar8] = (ulong)uVar4;
        if ((char)EVar11 < '\0') {
          uVar7 = (uint64_t)(short)uVar4;
          goto LAB_00d9a25c;
        }
        break;
      case Size4:
        uVar5 = DataExtractor::getU32(&Data,&local_38,(Error *)0x0);
        this->Operands[lVar8] = (ulong)uVar5;
        if ((char)EVar11 < '\0') {
          uVar7 = (uint64_t)(int)uVar5;
          goto LAB_00d9a25c;
        }
        break;
      case Size8:
        goto switchD_00d9a140_caseD_3;
      case SizeLEB:
        if ((char)EVar11 < '\0') {
          uVar7 = DataExtractor::getSLEB128(&Data,&local_38);
          goto LAB_00d9a25c;
        }
      case BaseTypeRef:
        uVar7 = DataExtractor::getULEB128(&Data,&local_38,(Error *)0x0);
        goto LAB_00d9a25c;
      case SizeAddr:
        if (AddressSize == '\x02') {
LAB_00d9a23d:
          uVar4 = DataExtractor::getU16(&Data,&local_38,(Error *)0x0);
          uVar7 = (uint64_t)uVar4;
          goto LAB_00d9a25c;
        }
        if (AddressSize == '\x04') {
LAB_00d9a22b:
          uVar5 = DataExtractor::getU32(&Data,&local_38,(Error *)0x0);
          uVar7 = (uint64_t)uVar5;
          goto LAB_00d9a25c;
        }
        if (AddressSize != '\b') {
          __assert_fail("AddressSize == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                        ,0xa5,
                        "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                       );
        }
        goto switchD_00d9a140_caseD_3;
      case SizeRefAddr:
        if (uVar10 == '\x02') goto LAB_00d9a23d;
        if (uVar10 == '\x04') goto LAB_00d9a22b;
        if (uVar10 != '\b') {
          __assert_fail("getRefAddrSize(AddressSize, Version) == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                        ,0xaf,
                        "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                       );
        }
switchD_00d9a140_caseD_3:
        uVar7 = DataExtractor::getU64(&Data,&local_38,(Error *)0x0);
LAB_00d9a25c:
        this->Operands[lVar8] = uVar7;
        break;
      case SizeBlock:
        if (lVar8 == 0) {
          return false;
        }
        this->Operands[lVar8] = local_38;
        local_38 = local_38 + this->Operands[0];
        break;
      default:
        llvm_unreachable_internal
                  ("Unknown DWARFExpression Op size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                   ,0xc5);
      }
      this->OperandEndOffsets[lVar8] = local_38;
    }
  }
  this->EndOffset = local_38;
  return cVar3 != '\0';
}

Assistant:

bool DWARFExpression::Operation::extract(DataExtractor Data, uint16_t Version,
                                         uint8_t AddressSize, uint64_t Offset) {
  Opcode = Data.getU8(&Offset);

  Desc = getOpDesc(Opcode);
  if (Desc.Version == Operation::DwarfNA) {
    EndOffset = Offset;
    return false;
  }

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    switch (Size & ~Operation::SignBit) {
    case Operation::Size1:
      Operands[Operand] = Data.getU8(&Offset);
      if (Signed)
        Operands[Operand] = (int8_t)Operands[Operand];
      break;
    case Operation::Size2:
      Operands[Operand] = Data.getU16(&Offset);
      if (Signed)
        Operands[Operand] = (int16_t)Operands[Operand];
      break;
    case Operation::Size4:
      Operands[Operand] = Data.getU32(&Offset);
      if (Signed)
        Operands[Operand] = (int32_t)Operands[Operand];
      break;
    case Operation::Size8:
      Operands[Operand] = Data.getU64(&Offset);
      break;
    case Operation::SizeAddr:
      if (AddressSize == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (AddressSize == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(AddressSize == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeRefAddr:
      if (getRefAddrSize(AddressSize, Version) == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (getRefAddrSize(AddressSize, Version) == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(getRefAddrSize(AddressSize, Version) == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeLEB:
      if (Signed)
        Operands[Operand] = Data.getSLEB128(&Offset);
      else
        Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::BaseTypeRef:
      Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::SizeBlock:
      // We need a size, so this cannot be the first operand
      if (Operand == 0)
        return false;
      // Store the offset of the block as the value.
      Operands[Operand] = Offset;
      Offset += Operands[Operand - 1];
      break;
    default:
      llvm_unreachable("Unknown DWARFExpression Op size");
    }

    OperandEndOffsets[Operand] = Offset;
  }

  EndOffset = Offset;
  return true;
}